

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile_impl.h
# Opt level: O2

void __thiscall HG::ProfileImpl::~ProfileImpl(ProfileImpl *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"dtor: ");
  poVar1 = std::operator<<(poVar1,(string *)this);
  poVar1 = std::operator<<(poVar1," @");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

ProfileImpl::~ProfileImpl() { std::cout << "dtor: " << name.data << " @" << this << '\n'; }